

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# funchook_unix.c
# Opt level: O2

int funchook_page_alloc(funchook_t *funchook,funchook_page_t **page_out,uint8_t *func,
                       ip_displacement_t *disp)

{
  size_t sVar1;
  uint8_t *puVar2;
  char cVar3;
  FILE *__stream;
  char *pcVar4;
  void *pvVar5;
  ulong uVar6;
  funchook_page_t *pfVar7;
  int *piVar8;
  uint uVar9;
  int iVar10;
  uint8_t *puVar11;
  void *pvVar12;
  void *addrs [2];
  uint8_t *local_1050;
  size_t start;
  char *local_1040;
  char buf [4096];
  
  iVar10 = 0;
  do {
    if (iVar10 == 3) {
      funchook_set_error_message(funchook,"Failed to allocate memory in unused regions");
      return 8;
    }
    __stream = fopen("/proc/self/maps","r");
    if (__stream == (FILE *)0x0) {
      piVar8 = __errno_location();
      pcVar4 = strerror_r(*piVar8,buf,0x40);
      funchook_set_error_message(funchook,"Failed to open /proc/self/maps (%s)",pcVar4);
      return -1;
    }
    addrs[0] = (void *)0x0;
    addrs[1] = (void *)0x0;
    pvVar12 = (void *)0x0;
    puVar2 = (uint8_t *)0x0;
    do {
      do {
        puVar11 = puVar2;
        local_1040 = buf;
        pcVar4 = fgets(local_1040,0x1000,__stream);
        if (((pcVar4 == (char *)0x0) || (cVar3 = scan_address(&local_1040,&start), cVar3 != '-')) ||
           (cVar3 = scan_address(&local_1040,(size_t *)&local_1050), sVar1 = start,
           puVar2 = local_1050, cVar3 != ' ')) {
          uVar6 = (long)puVar11 - (long)func;
          if (puVar11 < func || uVar6 == 0) {
            addrs[0] = pvVar12;
            fclose(__stream);
            funchook_set_error_message(funchook,"Could not find a free region near %p",func);
            return 8;
          }
          goto LAB_00102029;
        }
        funchook_log(funchook,"  process map: %016lx-%016lx, prev_end=%lx,addr={%lx,%lx},psz=%lx\n",
                     start,local_1050,puVar11,pvVar12,0,0x1000);
      } while (sVar1 < puVar11 + 0x1000);
      pvVar5 = (void *)(sVar1 - 0x1000);
      if (0x7ffffffe < (ulong)((long)func - (long)(sVar1 - 0x1000))) {
        pvVar5 = pvVar12;
      }
      if (sVar1 < func) {
        pvVar12 = pvVar5;
      }
      uVar6 = (long)puVar11 - (long)func;
    } while (puVar11 < func || uVar6 == 0);
LAB_00102029:
    puVar2 = puVar11;
    if (0x7ffffffe < uVar6) {
      puVar11 = (uint8_t *)0x0;
      puVar2 = (uint8_t *)addrs[1];
    }
    addrs[1] = puVar2;
    addrs[0] = pvVar12;
    funchook_log(funchook,"  -- Use address %p or %p for function %p\n",pvVar12,puVar11,func);
    fclose(__stream);
    for (uVar9 = 1; -1 < (int)uVar9; uVar9 = uVar9 - 1) {
      pvVar12 = addrs[uVar9];
      if (pvVar12 != (void *)0x0) {
        pfVar7 = (funchook_page_t *)mmap(pvVar12,0x1000,3,0x22,-1,0);
        *page_out = pfVar7;
        if (((ulong)((long)func - (long)pfVar7) < 0x7fffefff) ||
           ((ulong)((long)pfVar7 - (long)func) < 0x7fffefff)) {
          funchook_log(funchook,"  allocate page %p (size=%lu)\n",pfVar7,0x1000);
          return 0;
        }
        if (pfVar7 == (funchook_page_t *)0xffffffffffffffff) {
          piVar8 = __errno_location();
          pcVar4 = strerror_r(*piVar8,buf,0x80);
          funchook_set_error_message(funchook,"mmap failed(addr=%p): %s",pvVar12,pcVar4);
          return 8;
        }
        funchook_log(funchook,"  try to allocate %p but %p (size=%lu)\n",pvVar12,pfVar7,0x1000);
        munmap(*page_out,0x1000);
      }
    }
    iVar10 = iVar10 + 1;
  } while( true );
}

Assistant:

int funchook_page_alloc(funchook_t *funchook, funchook_page_t **page_out, uint8_t *func, ip_displacement_t *disp)
{
#if defined(CPU_64BIT)
    int loop_cnt;

    /* Loop three times just to avoid rare cases such as
     * unused memory region is used between 'get_free_address()'
     * and 'mmap()'.
     */
    for (loop_cnt = 0; loop_cnt < 3; loop_cnt++) {
        void *addrs[2];
        int rv = get_free_address(funchook, func, addrs);
        int i;

        if (rv != 0) {
            return rv;
        }
        for (i = 1; i >= 0; i--) {
            /* Try to use addr[1] (unused memory region after `func`)
             * and then addr[0] (before `func`)
             */
            if (addrs[i] == NULL) {
                continue;
            }
            *page_out = mmap(addrs[i], page_size, PROT_READ | PROT_WRITE, MAP_PRIVATE | MAP_ANONYMOUS, -1, 0);
            if (SAFE_JUMP_DISTANCE(func, *page_out) ||
                    SAFE_JUMP_DISTANCE(*page_out, func)) {
                funchook_log(funchook, "  allocate page %p (size=%"PRIuPTR")\n", *page_out, page_size);
                return 0;
            }
            if (*page_out == MAP_FAILED) {
                char errbuf[128];

                funchook_set_error_message(funchook, "mmap failed(addr=%p): %s", addrs[i],
                                           funchook_strerror(errno, errbuf, sizeof(errbuf)));
                return FUNCHOOK_ERROR_MEMORY_ALLOCATION;
            }
            funchook_log(funchook, "  try to allocate %p but %p (size=%"PRIuPTR")\n", addrs[i], *page_out, page_size);
            munmap(*page_out, page_size);
        }
    }
    funchook_set_error_message(funchook, "Failed to allocate memory in unused regions");
    return FUNCHOOK_ERROR_MEMORY_ALLOCATION;
#else
    char errbuf[128];

    *page_out = mmap(NULL, page_size, PROT_READ | PROT_WRITE, MAP_PRIVATE | MAP_ANONYMOUS, -1, 0);
    if (*page_out != MAP_FAILED) {
        funchook_log(funchook, "  allocate page %p (size=%"PRIuPTR")\n", *page_out, page_size);
        return 0;
    }
    funchook_set_error_message(funchook, "mmap failed: %s", funchook_strerror(errno, errbuf, sizeof(errbuf)));
    return FUNCHOOK_ERROR_MEMORY_ALLOCATION;
#endif
}